

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ReduceL1LayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducel1(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x4e2) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4e2;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    ReduceL1LayerParams::ReduceL1LayerParams(this_00.reducel1_);
    (this->layer_).reducel1_ = (ReduceL1LayerParams *)this_00;
  }
  return (ReduceL1LayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceL1LayerParams* NeuralNetworkLayer::mutable_reducel1() {
  if (!has_reducel1()) {
    clear_layer();
    set_has_reducel1();
    layer_.reducel1_ = new ::CoreML::Specification::ReduceL1LayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceL1)
  return layer_.reducel1_;
}